

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::BuildMessage
          (DescriptorBuilder *this,DescriptorProto *proto,Descriptor *parent,Descriptor *result)

{
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *this_00;
  undefined8 uVar1;
  Tables *this_01;
  long lVar2;
  Symbol symbol;
  Descriptor *pDVar3;
  string *psVar4;
  string *psVar5;
  void *pvVar6;
  Type *proto_00;
  Type *pTVar7;
  Type *proto_01;
  Type *proto_02;
  Type *pTVar8;
  Type *pTVar9;
  Type *pTVar10;
  Type *pTVar11;
  Type *descriptor;
  size_t sVar12;
  iterator iVar13;
  uint index;
  int iVar14;
  OptionsType *orig_options;
  RepeatedPtrFieldBase *pRVar15;
  RepeatedPtrFieldBase *pRVar16;
  long lVar17;
  int iVar18;
  long *plVar19;
  long lVar20;
  SubstituteArg *in_stack_fffffffffffffd48;
  string local_298;
  string *local_278;
  RepeatedPtrFieldBase *local_270;
  long local_268;
  SubstituteArg local_260;
  SubstituteArg local_230;
  undefined1 local_200 [48];
  SubstituteArg local_1d0;
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  SubstituteArg local_b0;
  RepeatedPtrFieldBase *local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  Descriptor *pDStack_70;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reserved_name_set;
  
  pDVar3 = parent;
  if (parent == (Descriptor *)0x0) {
    pDVar3 = (Descriptor *)this->file_;
  }
  psVar4 = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(pDVar3 + 8));
  if (psVar4->_M_string_length != 0) {
    std::__cxx11::string::_M_replace_aux((ulong)psVar4,psVar4->_M_string_length,0,'\x01');
  }
  std::__cxx11::string::_M_append((char *)psVar4,(ulong)(((proto->name_).ptr_)->_M_dataplus)._M_p);
  ValidateSymbolName(this,(proto->name_).ptr_,psVar4,&proto->super_Message);
  psVar5 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)result = psVar5;
  *(string **)(result + 8) = psVar4;
  *(FileDescriptor **)(result + 0x10) = this->file_;
  *(Descriptor **)(result + 0x18) = parent;
  *(undefined2 *)(result + 0x28) = 0;
  iVar18 = (proto->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x38) = iVar18;
  local_278 = (string *)parent;
  pvVar6 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar18 * 0x30);
  *(void **)(result + 0x40) = pvVar6;
  if (0 < (proto->oneof_decl_).super_RepeatedPtrFieldBase.current_size_) {
    lVar17 = 0;
    lVar20 = 0;
    do {
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                           (&(proto->oneof_decl_).super_RepeatedPtrFieldBase,(int)lVar20);
      BuildOneof(this,proto_00,result,(OneofDescriptor *)(*(long *)(result + 0x40) + lVar17));
      lVar20 = lVar20 + 1;
      lVar17 = lVar17 + 0x30;
    } while (lVar20 < (proto->oneof_decl_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar18 = (proto->field_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x2c) = iVar18;
  pvVar6 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar18 * 0xa8);
  *(void **)(result + 0x30) = pvVar6;
  if (0 < (proto->field_).super_RepeatedPtrFieldBase.current_size_) {
    lVar17 = 0;
    lVar20 = 0;
    do {
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(proto->field_).super_RepeatedPtrFieldBase,(int)lVar20);
      BuildFieldOrExtension
                (this,pTVar7,result,(FieldDescriptor *)(*(long *)(result + 0x30) + lVar17),false);
      lVar20 = lVar20 + 1;
      lVar17 = lVar17 + 0xa8;
    } while (lVar20 < (proto->field_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar18 = (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x48) = iVar18;
  pvVar6 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar18 * 0xa8);
  *(void **)(result + 0x50) = pvVar6;
  if (0 < (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar17 = 0;
    lVar20 = 0;
    do {
      proto_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                           (&(proto->nested_type_).super_RepeatedPtrFieldBase,(int)lVar20);
      BuildMessage(this,proto_01,result,(Descriptor *)(*(long *)(result + 0x50) + lVar17));
      lVar20 = lVar20 + 1;
      lVar17 = lVar17 + 0xa8;
    } while (lVar20 < (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar18 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x58) = iVar18;
  pvVar6 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar18 * 0x38);
  *(void **)(result + 0x60) = pvVar6;
  if (0 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar17 = 0;
    lVar20 = 0;
    do {
      proto_02 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                           (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar20);
      BuildEnum(this,proto_02,result,(EnumDescriptor *)(*(long *)(result + 0x60) + lVar17));
      lVar20 = lVar20 + 1;
      lVar17 = lVar17 + 0x38;
    } while (lVar20 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar18 = (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x68) = iVar18;
  pvVar6 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar18 << 3);
  *(void **)(result + 0x70) = pvVar6;
  if (0 < (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_) {
    lVar17 = 0;
    lVar20 = 0;
    do {
      pTVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                         (&(proto->extension_range_).super_RepeatedPtrFieldBase,(int)lVar20);
      BuildExtensionRange(this,pTVar8,result,(ExtensionRange *)(*(long *)(result + 0x70) + lVar17));
      lVar20 = lVar20 + 1;
      lVar17 = lVar17 + 8;
    } while (lVar20 < (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar18 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x78) = iVar18;
  pvVar6 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar18 * 0xa8);
  *(void **)(result + 0x80) = pvVar6;
  if (0 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_) {
    lVar17 = 0;
    lVar20 = 0;
    do {
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar20);
      BuildFieldOrExtension
                (this,pTVar7,result,(FieldDescriptor *)(*(long *)(result + 0x80) + lVar17),true);
      lVar20 = lVar20 + 1;
      lVar17 = lVar17 + 0xa8;
    } while (lVar20 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar18 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x88) = iVar18;
  pvVar6 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar18 << 3);
  *(void **)(result + 0x90) = pvVar6;
  if (0 < (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_) {
    lVar17 = 0;
    do {
      pTVar9 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                         (&(proto->reserved_range_).super_RepeatedPtrFieldBase,(int)lVar17);
      uVar1._0_4_ = pTVar9->start_;
      uVar1._4_4_ = pTVar9->end_;
      *(undefined8 *)(*(long *)(result + 0x90) + lVar17 * 8) = uVar1;
      if ((int)(undefined4)uVar1 < 1) {
        AddError(this,*(string **)(result + 8),&pTVar9->super_Message,NUMBER,
                 "Reserved numbers must be positive integers.");
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar18 = (proto->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x98) = iVar18;
  pvVar6 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar18 * 8);
  *(void **)(result + 0xa0) = pvVar6;
  if (0 < (long)iVar18) {
    lVar17 = 0;
    do {
      this_01 = this->tables_;
      pTVar10 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&(proto->reserved_name_).super_RepeatedPtrFieldBase,(int)lVar17);
      psVar4 = DescriptorPool::Tables::AllocateString(this_01,pTVar10);
      *(string **)(*(long *)(result + 0xa0) + lVar17 * 8) = psVar4;
      lVar17 = lVar17 + 1;
    } while (iVar18 != lVar17);
  }
  if (((proto->_has_bits_).has_bits_[0] & 2) == 0) {
    *(undefined8 *)(result + 0x20) = 0;
  }
  else {
    orig_options = proto->options_;
    if (orig_options == (OptionsType *)0x0) {
      orig_options = (OptionsType *)&_MessageOptions_default_instance_;
    }
    AllocateOptionsImpl<google::protobuf::Descriptor>
              (this,*(string **)(result + 8),*(string **)(result + 8),orig_options,result);
  }
  local_78 = 1;
  symbol._4_4_ = uStack_74;
  symbol.type = 1;
  symbol.field_1.descriptor = result;
  pDStack_70 = result;
  AddSymbol(this,*(string **)(result + 8),local_278,*(string **)result,&proto->super_Message,symbol)
  ;
  if (0 < (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_) {
    this_00 = &proto->reserved_range_;
    index = 0;
    do {
      pTVar9 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,index);
      iVar14 = index + 1;
      iVar18 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
      local_268 = CONCAT44(local_268._4_4_,iVar14);
      local_270 = (RepeatedPtrFieldBase *)(ulong)index;
      if (iVar14 < iVar18) {
        do {
          pTVar11 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                              (&this_00->super_RepeatedPtrFieldBase,iVar14);
          if ((pTVar11->start_ < pTVar9->end_) && (pTVar9->start_ < pTVar11->end_)) {
            local_278 = *(string **)(result + 8);
            descriptor = internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                                   (&this_00->super_RepeatedPtrFieldBase,(int)local_270);
            reserved_name_set.
            super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_h._M_buckets =
                 (__buckets_ptr)
                 FastInt32ToBuffer(pTVar11->start_,
                                   (char *)((long)&reserved_name_set.
                                                                                                      
                                                  super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_h._M_bucket_count + 4));
            sVar12 = strlen((char *)reserved_name_set.
                                    super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_h._M_buckets);
            reserved_name_set.
            super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_h._M_bucket_count =
                 CONCAT44(reserved_name_set.
                          super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_h._M_bucket_count._4_4_,(int)sVar12);
            local_260.text_ = FastInt32ToBuffer(pTVar11->end_ + -1,local_260.scratch_);
            sVar12 = strlen(local_260.text_);
            local_260.size_ = (int)sVar12;
            local_230.text_ = FastInt32ToBuffer(pTVar9->start_,local_230.scratch_);
            sVar12 = strlen(local_230.text_);
            local_230.size_ = (int)sVar12;
            local_1a0.text_ = FastInt32ToBuffer(pTVar9->end_ + -1,local_1a0.scratch_);
            sVar12 = strlen(local_1a0.text_);
            local_1a0.size_ = (int)sVar12;
            local_1d0.text_ = (char *)0x0;
            local_1d0.size_ = -1;
            local_b0.text_ = (char *)0x0;
            local_b0.size_ = -1;
            local_e0.text_ = (char *)0x0;
            local_e0.size_ = -1;
            local_110.text_ = (char *)0x0;
            local_110.size_ = -1;
            local_140.text_ = (char *)0x0;
            local_140.size_ = -1;
            local_170.text_ = (char *)0x0;
            local_170.size_ = -1;
            strings::Substitute_abi_cxx11_
                      ((string *)local_200,
                       (strings *)
                       "Reserved range $0 to $1 overlaps with already-defined range $2 to $3.",
                       (char *)&reserved_name_set,&local_260,&local_230,&local_1a0,&local_1d0,
                       &local_b0,&local_e0,&local_110,&local_140,&local_170,
                       in_stack_fffffffffffffd48);
            AddError(this,local_278,&descriptor->super_Message,NUMBER,(string *)local_200);
            if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
              operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
            }
          }
          iVar14 = iVar14 + 1;
          iVar18 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
        } while (iVar14 < iVar18);
      }
      index = (uint)local_268;
    } while ((int)(uint)local_268 < iVar18);
  }
  reserved_name_set.
  super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_h._M_buckets =
       &reserved_name_set.
        super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_h._M_single_bucket;
  reserved_name_set.
  super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_h._M_bucket_count = 1;
  reserved_name_set.
  super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  reserved_name_set.
  super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_h._M_element_count = 0;
  reserved_name_set.
  super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  reserved_name_set.
  super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  reserved_name_set.
  super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (0 < (proto->reserved_name_).super_RepeatedPtrFieldBase.current_size_) {
    iVar18 = 0;
    do {
      pTVar10 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (&(proto->reserved_name_).super_RepeatedPtrFieldBase,iVar18);
      iVar13 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)&reserved_name_set,pTVar10);
      if (iVar13.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_260.text_ = (char *)&reserved_name_set;
        std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,google::protobuf::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,google::protobuf::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_260.text_,pTVar10,&local_260);
      }
      else {
        local_260.text_ = (pTVar10->_M_dataplus)._M_p;
        local_260.size_ = (int)pTVar10->_M_string_length;
        local_230.text_ = (char *)0x0;
        local_230.size_ = -1;
        local_1a0.text_ = (char *)0x0;
        local_1a0.size_ = -1;
        local_1d0.text_ = (char *)0x0;
        local_1d0.size_ = -1;
        local_b0.text_ = (char *)0x0;
        local_b0.size_ = -1;
        local_e0.text_ = (char *)0x0;
        local_e0.size_ = -1;
        local_110.text_ = (char *)0x0;
        local_110.size_ = -1;
        local_140.text_ = (char *)0x0;
        local_140.size_ = -1;
        local_170.text_ = (char *)0x0;
        local_170.size_ = -1;
        local_200._0_8_ = (pointer)0x0;
        local_200._8_4_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_298,(strings *)"Field name \"$0\" is reserved multiple times.",
                   (char *)&local_260,&local_230,&local_1a0,&local_1d0,&local_b0,&local_e0,
                   &local_110,&local_140,&local_170,(SubstituteArg *)local_200,
                   in_stack_fffffffffffffd48);
        AddError(this,pTVar10,&proto->super_Message,NAME,&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 < (proto->reserved_name_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < *(int *)(result + 0x2c)) {
    local_278 = (string *)&proto->extension_range_;
    local_270 = &(proto->reserved_range_).super_RepeatedPtrFieldBase;
    local_80 = &(proto->field_).super_RepeatedPtrFieldBase;
    lVar17 = 0;
    do {
      plVar19 = (long *)(lVar17 * 0xa8 + *(long *)(result + 0x30));
      iVar18 = *(int *)(result + 0x68);
      local_268 = lVar17;
      if (0 < iVar18) {
        lVar17 = 0;
        do {
          lVar20 = *(long *)(result + 0x70);
          if ((*(int *)(lVar20 + lVar17 * 8) <= (int)plVar19[7]) &&
             ((int)plVar19[7] < *(int *)(lVar20 + 4 + lVar17 * 8))) {
            psVar4 = (string *)plVar19[1];
            pTVar8 = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                               ((RepeatedPtrFieldBase *)local_278,(int)lVar17);
            local_260.text_ = FastInt32ToBuffer(*(int32 *)(lVar20 + lVar17 * 8),local_260.scratch_);
            sVar12 = strlen(local_260.text_);
            local_260.size_ = (int)sVar12;
            local_230.text_ =
                 FastInt32ToBuffer(*(int *)(lVar20 + 4 + lVar17 * 8) + -1,local_230.scratch_);
            sVar12 = strlen(local_230.text_);
            local_230.size_ = (int)sVar12;
            local_1a0.text_ = *(char **)*plVar19;
            local_1a0.size_ = *(int *)((undefined8 *)*plVar19 + 1);
            local_1d0.text_ = FastInt32ToBuffer((int32)plVar19[7],local_1d0.scratch_);
            sVar12 = strlen(local_1d0.text_);
            local_1d0.size_ = (int)sVar12;
            local_b0.text_ = (char *)0x0;
            local_b0.size_ = -1;
            local_e0.text_ = (char *)0x0;
            local_e0.size_ = -1;
            local_110.text_ = (char *)0x0;
            local_110.size_ = -1;
            local_140.text_ = (char *)0x0;
            local_140.size_ = -1;
            local_170.text_ = (char *)0x0;
            local_170.size_ = -1;
            local_200._0_8_ = (pointer)0x0;
            local_200._8_4_ = -1;
            strings::Substitute_abi_cxx11_
                      (&local_298,(strings *)"Extension range $0 to $1 includes field \"$2\" ($3).",
                       (char *)&local_260,&local_230,&local_1a0,&local_1d0,&local_b0,&local_e0,
                       &local_110,&local_140,&local_170,(SubstituteArg *)local_200,
                       in_stack_fffffffffffffd48);
            AddError(this,psVar4,&pTVar8->super_Message,NUMBER,&local_298);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
            }
            iVar18 = *(int *)(result + 0x68);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < iVar18);
      }
      iVar18 = *(int *)(result + 0x88);
      if (0 < iVar18) {
        lVar17 = 0;
        do {
          if ((*(int *)(*(long *)(result + 0x90) + lVar17 * 8) <= (int)plVar19[7]) &&
             ((int)plVar19[7] < *(int *)(*(long *)(result + 0x90) + 4 + lVar17 * 8))) {
            psVar4 = (string *)plVar19[1];
            pTVar9 = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                               (local_270,(int)lVar17);
            local_260.text_ = *(char **)*plVar19;
            local_260.size_ = *(int *)((undefined8 *)*plVar19 + 1);
            local_230.text_ = FastInt32ToBuffer((int32)plVar19[7],local_230.scratch_);
            sVar12 = strlen(local_230.text_);
            local_230.size_ = (int)sVar12;
            local_1a0.text_ = (char *)0x0;
            local_1a0.size_ = -1;
            local_1d0.text_ = (char *)0x0;
            local_1d0.size_ = -1;
            local_b0.text_ = (char *)0x0;
            local_b0.size_ = -1;
            local_e0.text_ = (char *)0x0;
            local_e0.size_ = -1;
            local_110.text_ = (char *)0x0;
            local_110.size_ = -1;
            local_140.text_ = (char *)0x0;
            local_140.size_ = -1;
            local_170.text_ = (char *)0x0;
            local_170.size_ = -1;
            local_200._0_8_ = (pointer)0x0;
            local_200._8_4_ = -1;
            strings::Substitute_abi_cxx11_
                      (&local_298,(strings *)"Field \"$0\" uses reserved number $1.",
                       (char *)&local_260,&local_230,&local_1a0,&local_1d0,&local_b0,&local_e0,
                       &local_110,&local_140,&local_170,(SubstituteArg *)local_200,
                       in_stack_fffffffffffffd48);
            AddError(this,psVar4,&pTVar9->super_Message,NUMBER,&local_298);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
            }
            iVar18 = *(int *)(result + 0x88);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < iVar18);
      }
      iVar13 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)&reserved_name_set,(key_type *)*plVar19);
      lVar17 = local_268;
      if (iVar13.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        psVar4 = (string *)plVar19[1];
        pTVar7 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                           (local_80,(int)local_268);
        local_260.text_ = *(char **)*plVar19;
        local_260.size_ = *(int *)((undefined8 *)*plVar19 + 1);
        local_230.text_ = (char *)0x0;
        local_230.size_ = -1;
        local_1a0.text_ = (char *)0x0;
        local_1a0.size_ = -1;
        local_1d0.text_ = (char *)0x0;
        local_1d0.size_ = -1;
        local_b0.text_ = (char *)0x0;
        local_b0.size_ = -1;
        local_e0.text_ = (char *)0x0;
        local_e0.size_ = -1;
        local_110.text_ = (char *)0x0;
        local_110.size_ = -1;
        local_140.text_ = (char *)0x0;
        local_140.size_ = -1;
        local_170.text_ = (char *)0x0;
        local_170.size_ = -1;
        local_200._0_8_ = (pointer)0x0;
        local_200._8_4_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_298,(strings *)"Field name \"$0\" is reserved.",(char *)&local_260,
                   &local_230,&local_1a0,&local_1d0,&local_b0,&local_e0,&local_110,&local_140,
                   &local_170,(SubstituteArg *)local_200,in_stack_fffffffffffffd48);
        AddError(this,psVar4,&pTVar7->super_Message,NAME,&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < *(int *)(result + 0x2c));
  }
  iVar18 = *(int *)(result + 0x68);
  if (0 < iVar18) {
    psVar4 = (string *)0x1;
    pRVar15 = (RepeatedPtrFieldBase *)0x0;
    do {
      lVar17 = *(long *)(result + 0x70);
      iVar14 = *(int *)(result + 0x88);
      local_278 = psVar4;
      if (0 < iVar14) {
        lVar20 = 0;
        do {
          lVar2 = *(long *)(result + 0x90);
          if ((*(int *)(lVar2 + lVar20 * 8) < *(int *)(lVar17 + 4 + (long)pRVar15 * 8)) &&
             (*(int *)(lVar17 + (long)pRVar15 * 8) < *(int *)(lVar2 + 4 + lVar20 * 8))) {
            psVar4 = *(string **)(result + 8);
            pTVar8 = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                               (&(proto->extension_range_).super_RepeatedPtrFieldBase,(int)pRVar15);
            local_260.text_ =
                 FastInt32ToBuffer(*(int32 *)(lVar17 + (long)pRVar15 * 8),local_260.scratch_);
            sVar12 = strlen(local_260.text_);
            local_260.size_ = (int)sVar12;
            local_230.text_ =
                 FastInt32ToBuffer(*(int *)(lVar17 + 4 + (long)pRVar15 * 8) + -1,local_230.scratch_)
            ;
            sVar12 = strlen(local_230.text_);
            local_230.size_ = (int)sVar12;
            local_1a0.text_ = FastInt32ToBuffer(*(int32 *)(lVar2 + lVar20 * 8),local_1a0.scratch_);
            sVar12 = strlen(local_1a0.text_);
            local_1a0.size_ = (int)sVar12;
            local_1d0.text_ =
                 FastInt32ToBuffer(*(int *)(lVar2 + 4 + lVar20 * 8) + -1,local_1d0.scratch_);
            sVar12 = strlen(local_1d0.text_);
            local_1d0.size_ = (int)sVar12;
            local_b0.text_ = (char *)0x0;
            local_b0.size_ = -1;
            local_e0.text_ = (char *)0x0;
            local_e0.size_ = -1;
            local_110.text_ = (char *)0x0;
            local_110.size_ = -1;
            local_140.text_ = (char *)0x0;
            local_140.size_ = -1;
            local_170.text_ = (char *)0x0;
            local_170.size_ = -1;
            local_200._0_8_ = (pointer)0x0;
            local_200._8_4_ = -1;
            strings::Substitute_abi_cxx11_
                      (&local_298,
                       (strings *)"Extension range $0 to $1 overlaps with reserved range $2 to $3.",
                       (char *)&local_260,&local_230,&local_1a0,&local_1d0,&local_b0,&local_e0,
                       &local_110,&local_140,&local_170,(SubstituteArg *)local_200,
                       in_stack_fffffffffffffd48);
            AddError(this,psVar4,&pTVar8->super_Message,NUMBER,&local_298);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
            }
            iVar14 = *(int *)(result + 0x88);
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < iVar14);
        iVar18 = *(int *)(result + 0x68);
      }
      pRVar16 = (RepeatedPtrFieldBase *)
                ((long)&((RepeatedPtrFieldBase *)&pRVar15->arena_)->arena_ + 1);
      lVar20 = (long)iVar18;
      psVar4 = local_278;
      if ((long)pRVar16 < lVar20) {
        do {
          local_270 = pRVar16;
          lVar20 = *(long *)(result + 0x70);
          if ((*(int *)(lVar20 + (long)psVar4 * 8) < *(int *)(lVar17 + 4 + (long)pRVar15 * 8)) &&
             (*(int *)(lVar17 + (long)pRVar15 * 8) < *(int *)(lVar20 + 4 + (long)psVar4 * 8))) {
            psVar5 = *(string **)(result + 8);
            pTVar8 = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                               (&(proto->extension_range_).super_RepeatedPtrFieldBase,(int)pRVar15);
            local_260.text_ =
                 FastInt32ToBuffer(*(int32 *)(lVar20 + (long)psVar4 * 8),local_260.scratch_);
            sVar12 = strlen(local_260.text_);
            local_260.size_ = (int)sVar12;
            local_230.text_ =
                 FastInt32ToBuffer(*(int *)(lVar20 + 4 + (long)psVar4 * 8) + -1,local_230.scratch_);
            sVar12 = strlen(local_230.text_);
            local_230.size_ = (int)sVar12;
            local_1a0.text_ =
                 FastInt32ToBuffer(*(int32 *)(lVar17 + (long)pRVar15 * 8),local_1a0.scratch_);
            sVar12 = strlen(local_1a0.text_);
            local_1a0.size_ = (int)sVar12;
            local_1d0.text_ =
                 FastInt32ToBuffer(*(int *)(lVar17 + 4 + (long)pRVar15 * 8) + -1,local_1d0.scratch_)
            ;
            sVar12 = strlen(local_1d0.text_);
            local_1d0.size_ = (int)sVar12;
            local_b0.text_ = (char *)0x0;
            local_b0.size_ = -1;
            local_e0.text_ = (char *)0x0;
            local_e0.size_ = -1;
            local_110.text_ = (char *)0x0;
            local_110.size_ = -1;
            local_140.text_ = (char *)0x0;
            local_140.size_ = -1;
            local_170.text_ = (char *)0x0;
            local_170.size_ = -1;
            local_200._0_8_ = (pointer)0x0;
            local_200._8_4_ = -1;
            strings::Substitute_abi_cxx11_
                      (&local_298,
                       (strings *)
                       "Extension range $0 to $1 overlaps with already-defined range $2 to $3.",
                       (char *)&local_260,&local_230,&local_1a0,&local_1d0,&local_b0,&local_e0,
                       &local_110,&local_140,&local_170,(SubstituteArg *)local_200,
                       in_stack_fffffffffffffd48);
            AddError(this,psVar5,&pTVar8->super_Message,NUMBER,&local_298);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
            }
            iVar18 = *(int *)(result + 0x68);
          }
          psVar4 = (string *)((long)&(psVar4->_M_dataplus)._M_p + 1);
          pRVar16 = local_270;
        } while ((int)psVar4 < iVar18);
        lVar20 = (long)iVar18;
      }
      psVar4 = (string *)((long)&(local_278->_M_dataplus)._M_p + 1);
      pRVar15 = pRVar16;
    } while ((long)pRVar16 < lVar20);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&reserved_name_set);
  return;
}

Assistant:

void DescriptorBuilder::BuildMessage(const DescriptorProto& proto,
                                     const Descriptor* parent,
                                     Descriptor* result) {
  const string& scope = (parent == NULL) ?
    file_->package() : parent->full_name();
  string* full_name = tables_->AllocateString(scope);
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_            = tables_->AllocateString(proto.name());
  result->full_name_       = full_name;
  result->file_            = file_;
  result->containing_type_ = parent;
  result->is_placeholder_  = false;
  result->is_unqualified_placeholder_ = false;

  // Build oneofs first so that fields and extension ranges can refer to them.
  BUILD_ARRAY(proto, result, oneof_decl     , BuildOneof         , result);
  BUILD_ARRAY(proto, result, field          , BuildField         , result);
  BUILD_ARRAY(proto, result, nested_type    , BuildMessage       , result);
  BUILD_ARRAY(proto, result, enum_type      , BuildEnum          , result);
  BUILD_ARRAY(proto, result, extension_range, BuildExtensionRange, result);
  BUILD_ARRAY(proto, result, extension      , BuildExtension     , result);
  BUILD_ARRAY(proto, result, reserved_range , BuildReservedRange , result);

  // Copy reserved names.
  int reserved_name_count = proto.reserved_name_size();
  result->reserved_name_count_ = reserved_name_count;
  result->reserved_names_ =
      tables_->AllocateArray<const string*>(reserved_name_count);
  for (int i = 0; i < reserved_name_count; ++i) {
    result->reserved_names_[i] =
        tables_->AllocateString(proto.reserved_name(i));
  }

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));

  for (int i = 0; i < proto.reserved_range_size(); i++) {
    const DescriptorProto_ReservedRange& range1 = proto.reserved_range(i);
    for (int j = i + 1; j < proto.reserved_range_size(); j++) {
      const DescriptorProto_ReservedRange& range2 = proto.reserved_range(j);
      if (range1.end() > range2.start() && range2.end() > range1.start()) {
        AddError(result->full_name(), proto.reserved_range(i),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("Reserved range $0 to $1 overlaps with "
                                     "already-defined range $2 to $3.",
                                     range2.start(), range2.end() - 1,
                                     range1.start(), range1.end() - 1));
      }
    }
  }

  hash_set<string> reserved_name_set;
  for (int i = 0; i < proto.reserved_name_size(); i++) {
    const string& name = proto.reserved_name(i);
    if (reserved_name_set.find(name) == reserved_name_set.end()) {
      reserved_name_set.insert(name);
    } else {
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME,
               strings::Substitute(
                 "Field name \"$0\" is reserved multiple times.",
                 name));
    }
  }

  for (int i = 0; i < result->field_count(); i++) {
    const FieldDescriptor* field = result->field(i);
    for (int j = 0; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range = result->extension_range(j);
      if (range->start <= field->number() && field->number() < range->end) {
        AddError(field->full_name(), proto.extension_range(j),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute(
                   "Extension range $0 to $1 includes field \"$2\" ($3).",
                   range->start, range->end - 1,
                   field->name(), field->number()));
      }
    }
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range = result->reserved_range(j);
      if (range->start <= field->number() && field->number() < range->end) {
        AddError(field->full_name(), proto.reserved_range(j),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute(
                   "Field \"$0\" uses reserved number $1.",
                   field->name(), field->number()));
      }
    }
    if (reserved_name_set.find(field->name()) != reserved_name_set.end()) {
      AddError(field->full_name(), proto.field(i),
               DescriptorPool::ErrorCollector::NAME,
               strings::Substitute(
                 "Field name \"$0\" is reserved.", field->name()));
    }
  }

  // Check that extension ranges don't overlap and don't include
  // reserved field numbers.
  for (int i = 0; i < result->extension_range_count(); i++) {
    const Descriptor::ExtensionRange* range1 = result->extension_range(i);
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range2 = result->reserved_range(j);
      if (range1->end > range2->start && range2->end > range1->start) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("Extension range $0 to $1 overlaps with "
                                     "reserved range $2 to $3.",
                                     range1->start, range1->end - 1,
                                     range2->start, range2->end - 1));
      }
    }
    for (int j = i + 1; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range2 = result->extension_range(j);
      if (range1->end > range2->start && range2->end > range1->start) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("Extension range $0 to $1 overlaps with "
                                     "already-defined range $2 to $3.",
                                     range2->start, range2->end - 1,
                                     range1->start, range1->end - 1));
      }
    }
  }
}